

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O1

ssize_t MAFSA_automaton_search
                  (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *out,size_t sz_out,
                  size_t *sz_out_result)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint32_t uVar6;
  ulong uVar7;
  uint32_t uVar8;
  
  uVar2 = 0xffffffffffffffff;
  if (sz_l != 0) {
    uVar7 = 0;
    do {
      uVar8 = *ma->ptr_nodes;
      uVar4 = uVar7 & 0xffffffff;
      do {
        uVar3 = (uint)uVar4;
        if ((sz_l <= uVar4) || ((int)uVar8 < 0)) break;
        uVar6 = ma->ptr_links[uVar8];
        uVar5 = 0;
        if (uVar6 != 0xff000000) {
          uVar1 = uVar8;
          do {
            uVar1 = uVar1 + 1;
            if (l[uVar4] == (MAFSA_letter)(uVar6 >> 0x18)) {
              uVar5 = uVar6 & 0xffffff;
              break;
            }
            uVar6 = ma->ptr_links[uVar1];
            uVar5 = 0;
          } while (uVar6 != 0xff000000);
        }
        if (uVar5 != 0) {
          uVar8 = ma->ptr_nodes[uVar5];
        }
        uVar3 = uVar3 + 1;
        uVar4 = (ulong)uVar3;
      } while (uVar5 != 0);
      if ((int)uVar8 < 0) {
        uVar4 = uVar3 - uVar7;
        if (sz_out <= uVar3 - uVar7) {
          uVar4 = sz_out;
        }
        memcpy(out,l + uVar7,uVar4);
        uVar2 = uVar7;
        if (sz_out_result != (size_t *)0x0) {
          *sz_out_result = uVar4;
        }
      }
      if ((int)uVar8 < 0) {
        return uVar2;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != sz_l);
  }
  return -1;
}

Assistant:

extern ssize_t MAFSA_automaton_search(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l,
    MAFSA_letter *out, size_t sz_out, size_t *sz_out_result)
{
    ssize_t cur_pos;

    for (cur_pos = 0; cur_pos < sz_l; cur_pos++)
    {
        uint32_t i = cur_pos;
        uint32_t current = ma->ptr_nodes[0];
        uint32_t where = 0;

        while (i < sz_l && !node_is_final(current))
        {
            MAFSA_letter label = l[i++];

            if (0 != (where = MAFSA_delta(ma->ptr_links, current, label)))
            {
                current = ma->ptr_nodes[where];
            }
            else
            {
                break;
            }
        }

        if (node_is_final(current))
        {
            ssize_t cpy_sz;
            
            cpy_sz = i - cur_pos < sz_out ? i - cur_pos : sz_out;
            memcpy(out, l + cur_pos, cpy_sz);

            if (sz_out_result)
            {
                *sz_out_result = cpy_sz;
            }

            return cur_pos;
        }
    }

    return -1;
}